

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test4.c
# Opt level: O0

void print_hex(char *s)

{
  byte bVar1;
  byte *pbStack_18;
  uchar ch;
  char *iter;
  char *s_local;
  
  pbStack_18 = (byte *)s;
  while( true ) {
    bVar1 = *pbStack_18;
    if (bVar1 == 0) break;
    if (bVar1 == 0x2c) {
      printf(",");
      pbStack_18 = pbStack_18 + 1;
    }
    else {
      printf("%x ",(ulong)bVar1);
      pbStack_18 = pbStack_18 + 1;
    }
  }
  putchar(10);
  return;
}

Assistant:

void print_hex(const char *s)
{
	const char *iter = s;
	unsigned char ch;
	while ((ch = *iter++) != 0)
	{
		if (',' != ch)
			printf("%x ", ch);
		else
			printf(",");
	}
	putchar('\n');
}